

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O1

void embree::avx::FlatLinearCurveMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined8 *puVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar37;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar38;
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar47;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float fVar51;
  undefined4 uVar52;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar74;
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar75 [32];
  float fVar77;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [64];
  undefined1 auVar90 [32];
  float in_register_0000151c;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  LineIntersectorHitM<8> hit;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  RTCFilterFunctionNArguments local_370;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar76 [64];
  
  pSVar8 = context->scene;
  uVar20 = line->sharedGeomID;
  uVar19 = (line->v0).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[uVar20].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  uVar21 = (line->v0).field_0.i[1];
  uVar2 = (line->v0).field_0.i[4];
  auVar26._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar2 * (long)p_Var11);
  auVar26._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar19 * (long)p_Var11);
  uVar3 = (line->v0).field_0.i[2];
  uVar4 = (line->v0).field_0.i[3];
  uVar5 = (line->v0).field_0.i[5];
  auVar41._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar5 * (long)p_Var11);
  auVar41._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar21 * (long)p_Var11);
  uVar6 = (line->v0).field_0.i[6];
  auVar53._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar6 * (long)p_Var11);
  auVar53._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar3 * (long)p_Var11);
  uVar7 = (line->v0).field_0.i[7];
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar7 * (long)p_Var11);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar4 * (long)p_Var11);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar2 + 1) * (long)p_Var11);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar19 + 1) * (long)p_Var11);
  auVar67._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar67._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar21 + 1) * (long)p_Var11);
  auVar69._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar69._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar3 + 1) * (long)p_Var11);
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar4 + 1) * (long)p_Var11);
  auVar14 = vunpcklps_avx(auVar26,auVar53);
  auVar12 = vunpckhps_avx(auVar26,auVar53);
  auVar92 = vunpcklps_avx(auVar41,auVar61);
  auVar13 = vunpckhps_avx(auVar41,auVar61);
  auVar41 = vunpcklps_avx(auVar14,auVar92);
  auVar26 = vunpckhps_avx(auVar14,auVar92);
  local_220 = vunpcklps_avx(auVar12,auVar13);
  local_1a0 = vunpckhps_avx(auVar12,auVar13);
  auVar14 = vunpcklps_avx(auVar64,auVar69);
  auVar12 = vunpckhps_avx(auVar64,auVar69);
  auVar92 = vunpcklps_avx(auVar67,auVar78);
  auVar13 = vunpckhps_avx(auVar67,auVar78);
  local_1e0 = vunpcklps_avx(auVar14,auVar92);
  local_200 = vunpckhps_avx(auVar14,auVar92);
  local_3c0 = vunpcklps_avx(auVar12,auVar13);
  auVar39 = vpcmpeqd_avx(local_3c0._0_16_,local_3c0._0_16_);
  auVar40 = vpcmpeqd_avx(auVar39,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar39 = vpcmpeqd_avx(auVar39,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_1c0 = vunpckhps_avx(auVar12,auVar13);
  local_340._16_16_ = auVar39;
  local_340._0_16_ = auVar40;
  local_2f0 = vshufps_avx(ZEXT416(uVar20),ZEXT416(uVar20),0);
  local_300 = local_2f0;
  fVar51 = pre->ray_space[k].vy.field_0.m128[0];
  fVar25 = pre->ray_space[k].vy.field_0.m128[1];
  fVar32 = pre->ray_space[k].vz.field_0.m128[0];
  fVar33 = pre->ray_space[k].vz.field_0.m128[1];
  fVar74 = *(float *)(ray + k * 4 + 0x20);
  auVar71._4_4_ = fVar74;
  auVar71._0_4_ = fVar74;
  auVar71._8_4_ = fVar74;
  auVar71._12_4_ = fVar74;
  auVar71._16_4_ = fVar74;
  auVar71._20_4_ = fVar74;
  auVar71._24_4_ = fVar74;
  auVar71._28_4_ = fVar74;
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar42._4_4_ = uVar52;
  auVar42._0_4_ = uVar52;
  auVar42._8_4_ = uVar52;
  auVar42._12_4_ = uVar52;
  auVar42._16_4_ = uVar52;
  auVar42._20_4_ = uVar52;
  auVar42._24_4_ = uVar52;
  auVar42._28_4_ = uVar52;
  auVar12 = vsubps_avx(auVar26,auVar71);
  auVar13 = vsubps_avx(local_220,auVar42);
  fVar48 = auVar13._0_4_;
  fVar49 = auVar13._4_4_;
  fVar50 = auVar13._8_4_;
  fVar45 = auVar13._12_4_;
  fVar47 = auVar13._16_4_;
  fVar56 = auVar13._20_4_;
  fVar87 = auVar13._24_4_;
  fVar59 = auVar12._0_4_;
  fVar60 = auVar12._4_4_;
  fVar38 = auVar12._8_4_;
  fVar46 = auVar12._12_4_;
  fVar55 = auVar12._16_4_;
  fVar57 = auVar12._20_4_;
  fVar88 = auVar12._24_4_;
  fVar34 = pre->ray_space[k].vy.field_0.m128[2];
  fVar35 = pre->ray_space[k].vz.field_0.m128[2];
  fVar89 = auVar13._28_4_;
  fVar36 = pre->ray_space[k].vx.field_0.m128[0];
  uVar52 = *(undefined4 *)(ray + k * 4);
  auVar70._4_4_ = uVar52;
  auVar70._0_4_ = uVar52;
  auVar70._8_4_ = uVar52;
  auVar70._12_4_ = uVar52;
  auVar70._16_4_ = uVar52;
  auVar70._20_4_ = uVar52;
  auVar70._24_4_ = uVar52;
  auVar70._28_4_ = uVar52;
  auVar13 = vsubps_avx(auVar41,auVar70);
  fVar77 = auVar13._0_4_;
  fVar80 = auVar13._4_4_;
  fVar81 = auVar13._8_4_;
  fVar82 = auVar13._12_4_;
  fVar83 = auVar13._16_4_;
  fVar84 = auVar13._20_4_;
  fVar85 = auVar13._24_4_;
  auVar54._0_4_ = fVar77 * fVar36 + fVar32 * fVar48 + fVar51 * fVar59;
  auVar54._4_4_ = fVar80 * fVar36 + fVar32 * fVar49 + fVar51 * fVar60;
  auVar54._8_4_ = fVar81 * fVar36 + fVar32 * fVar50 + fVar51 * fVar38;
  auVar54._12_4_ = fVar82 * fVar36 + fVar32 * fVar45 + fVar51 * fVar46;
  auVar54._16_4_ = fVar83 * fVar36 + fVar32 * fVar47 + fVar51 * fVar55;
  auVar54._20_4_ = fVar84 * fVar36 + fVar32 * fVar56 + fVar51 * fVar57;
  auVar54._24_4_ = fVar85 * fVar36 + fVar32 * fVar87 + fVar51 * fVar88;
  auVar54._28_4_ = fVar89 + in_register_0000151c + auVar26._28_4_;
  fVar37 = pre->ray_space[k].vx.field_0.m128[1];
  auVar90._0_4_ = fVar77 * fVar37 + fVar25 * fVar59 + fVar33 * fVar48;
  auVar90._4_4_ = fVar80 * fVar37 + fVar25 * fVar60 + fVar33 * fVar49;
  auVar90._8_4_ = fVar81 * fVar37 + fVar25 * fVar38 + fVar33 * fVar50;
  auVar90._12_4_ = fVar82 * fVar37 + fVar25 * fVar46 + fVar33 * fVar45;
  auVar90._16_4_ = fVar83 * fVar37 + fVar25 * fVar55 + fVar33 * fVar47;
  auVar90._20_4_ = fVar84 * fVar37 + fVar25 * fVar57 + fVar33 * fVar56;
  auVar90._24_4_ = fVar85 * fVar37 + fVar25 * fVar88 + fVar33 * fVar87;
  auVar90._28_4_ = fVar89 + local_220._28_4_ + in_register_0000151c;
  fVar58 = pre->ray_space[k].vx.field_0.m128[2];
  auVar91._0_4_ = fVar58 * fVar77 + fVar59 * fVar34 + fVar48 * fVar35;
  auVar91._4_4_ = fVar58 * fVar80 + fVar60 * fVar34 + fVar49 * fVar35;
  auVar91._8_4_ = fVar58 * fVar81 + fVar38 * fVar34 + fVar50 * fVar35;
  auVar91._12_4_ = fVar58 * fVar82 + fVar46 * fVar34 + fVar45 * fVar35;
  auVar91._16_4_ = fVar58 * fVar83 + fVar55 * fVar34 + fVar47 * fVar35;
  auVar91._20_4_ = fVar58 * fVar84 + fVar57 * fVar34 + fVar56 * fVar35;
  auVar91._24_4_ = fVar58 * fVar85 + fVar88 * fVar34 + fVar87 * fVar35;
  auVar91._28_4_ = auVar13._28_4_ + auVar12._28_4_ + fVar89;
  auVar12 = vsubps_avx(local_3c0,auVar42);
  fVar48 = auVar12._0_4_;
  fVar60 = auVar12._4_4_;
  fVar45 = auVar12._8_4_;
  fVar55 = auVar12._12_4_;
  fVar87 = auVar12._16_4_;
  fVar77 = auVar12._20_4_;
  fVar82 = auVar12._24_4_;
  auVar13 = vsubps_avx(local_200,auVar71);
  fVar59 = auVar13._0_4_;
  fVar50 = auVar13._4_4_;
  fVar46 = auVar13._8_4_;
  fVar56 = auVar13._12_4_;
  fVar88 = auVar13._16_4_;
  fVar80 = auVar13._20_4_;
  fVar83 = auVar13._24_4_;
  fVar74 = local_3c0._28_4_ + fVar74;
  auVar14 = vsubps_avx(local_1e0,auVar70);
  fVar49 = auVar14._0_4_;
  fVar38 = auVar14._4_4_;
  fVar47 = auVar14._8_4_;
  fVar57 = auVar14._12_4_;
  fVar89 = auVar14._16_4_;
  fVar81 = auVar14._20_4_;
  fVar84 = auVar14._24_4_;
  auVar65._0_4_ = fVar36 * fVar49 + fVar32 * fVar48 + fVar51 * fVar59;
  auVar65._4_4_ = fVar36 * fVar38 + fVar32 * fVar60 + fVar51 * fVar50;
  auVar65._8_4_ = fVar36 * fVar47 + fVar32 * fVar45 + fVar51 * fVar46;
  auVar65._12_4_ = fVar36 * fVar57 + fVar32 * fVar55 + fVar51 * fVar56;
  auVar65._16_4_ = fVar36 * fVar89 + fVar32 * fVar87 + fVar51 * fVar88;
  auVar65._20_4_ = fVar36 * fVar81 + fVar32 * fVar77 + fVar51 * fVar80;
  auVar65._24_4_ = fVar36 * fVar84 + fVar32 * fVar82 + fVar51 * fVar83;
  auVar65._28_4_ = auVar13._28_4_ + fVar74;
  auVar68._0_4_ = fVar25 * fVar59 + fVar33 * fVar48 + fVar37 * fVar49;
  auVar68._4_4_ = fVar25 * fVar50 + fVar33 * fVar60 + fVar37 * fVar38;
  auVar68._8_4_ = fVar25 * fVar46 + fVar33 * fVar45 + fVar37 * fVar47;
  auVar68._12_4_ = fVar25 * fVar56 + fVar33 * fVar55 + fVar37 * fVar57;
  auVar68._16_4_ = fVar25 * fVar88 + fVar33 * fVar87 + fVar37 * fVar89;
  auVar68._20_4_ = fVar25 * fVar80 + fVar33 * fVar77 + fVar37 * fVar81;
  auVar68._24_4_ = fVar25 * fVar83 + fVar33 * fVar82 + fVar37 * fVar84;
  auVar68._28_4_ = local_3c0._28_4_ + fVar32 + fVar37;
  auVar27._0_4_ = fVar58 * fVar49 + fVar34 * fVar59 + fVar35 * fVar48;
  auVar27._4_4_ = fVar58 * fVar38 + fVar34 * fVar50 + fVar35 * fVar60;
  auVar27._8_4_ = fVar58 * fVar47 + fVar34 * fVar46 + fVar35 * fVar45;
  auVar27._12_4_ = fVar58 * fVar57 + fVar34 * fVar56 + fVar35 * fVar55;
  auVar27._16_4_ = fVar58 * fVar89 + fVar34 * fVar88 + fVar35 * fVar87;
  auVar27._20_4_ = fVar58 * fVar81 + fVar34 * fVar80 + fVar35 * fVar77;
  auVar27._24_4_ = fVar58 * fVar84 + fVar34 * fVar83 + fVar35 * fVar82;
  auVar27._28_4_ = fVar37 + fVar34 + auVar12._28_4_;
  auVar13 = vsubps_avx(auVar65,auVar54);
  auVar12 = vsubps_avx(auVar68,auVar90);
  fVar51 = auVar12._0_4_;
  fVar32 = auVar12._4_4_;
  fVar34 = auVar12._8_4_;
  fVar36 = auVar12._12_4_;
  fVar58 = auVar12._16_4_;
  fVar59 = auVar12._20_4_;
  fVar60 = auVar12._24_4_;
  fVar25 = auVar13._0_4_;
  fVar33 = auVar13._4_4_;
  fVar35 = auVar13._8_4_;
  fVar37 = auVar13._12_4_;
  fVar48 = auVar13._16_4_;
  fVar49 = auVar13._20_4_;
  fVar50 = auVar13._24_4_;
  auVar66._0_4_ = fVar25 * fVar25 + fVar51 * fVar51;
  auVar66._4_4_ = fVar33 * fVar33 + fVar32 * fVar32;
  auVar66._8_4_ = fVar35 * fVar35 + fVar34 * fVar34;
  auVar66._12_4_ = fVar37 * fVar37 + fVar36 * fVar36;
  auVar66._16_4_ = fVar48 * fVar48 + fVar58 * fVar58;
  auVar66._20_4_ = fVar49 * fVar49 + fVar59 * fVar59;
  auVar66._24_4_ = fVar50 * fVar50 + fVar60 * fVar60;
  auVar66._28_4_ = auVar68._28_4_ + auVar65._28_4_;
  auVar14._4_4_ = fVar32 * -auVar90._4_4_;
  auVar14._0_4_ = fVar51 * -auVar90._0_4_;
  auVar14._8_4_ = fVar34 * -auVar90._8_4_;
  auVar14._12_4_ = fVar36 * -auVar90._12_4_;
  auVar14._16_4_ = fVar58 * -auVar90._16_4_;
  auVar14._20_4_ = fVar59 * -auVar90._20_4_;
  auVar14._24_4_ = fVar60 * -auVar90._24_4_;
  auVar14._28_4_ = -auVar90._28_4_;
  auVar12 = vrcpps_avx(auVar66);
  auVar92._4_4_ = auVar54._4_4_ * fVar33;
  auVar92._0_4_ = auVar54._0_4_ * fVar25;
  auVar92._8_4_ = auVar54._8_4_ * fVar35;
  auVar92._12_4_ = auVar54._12_4_ * fVar37;
  auVar92._16_4_ = auVar54._16_4_ * fVar48;
  auVar92._20_4_ = auVar54._20_4_ * fVar49;
  auVar92._24_4_ = auVar54._24_4_ * fVar50;
  auVar92._28_4_ = fVar74;
  auVar14 = vsubps_avx(auVar14,auVar92);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = &DAT_3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar72._16_4_ = 0x3f800000;
  auVar72._20_4_ = 0x3f800000;
  auVar72._24_4_ = 0x3f800000;
  auVar72._28_4_ = 0x3f800000;
  fVar74 = auVar12._0_4_;
  fVar38 = auVar12._4_4_;
  auVar15._4_4_ = fVar38 * auVar66._4_4_;
  auVar15._0_4_ = fVar74 * auVar66._0_4_;
  fVar45 = auVar12._8_4_;
  auVar15._8_4_ = fVar45 * auVar66._8_4_;
  fVar46 = auVar12._12_4_;
  auVar15._12_4_ = fVar46 * auVar66._12_4_;
  fVar47 = auVar12._16_4_;
  auVar15._16_4_ = fVar47 * auVar66._16_4_;
  fVar55 = auVar12._20_4_;
  auVar15._20_4_ = fVar55 * auVar66._20_4_;
  fVar56 = auVar12._24_4_;
  auVar15._24_4_ = fVar56 * auVar66._24_4_;
  auVar15._28_4_ = auVar66._28_4_;
  auVar92 = vsubps_avx(auVar72,auVar15);
  auVar16._4_4_ = auVar14._4_4_ * (fVar38 + fVar38 * auVar92._4_4_);
  auVar16._0_4_ = auVar14._0_4_ * (fVar74 + fVar74 * auVar92._0_4_);
  auVar16._8_4_ = auVar14._8_4_ * (fVar45 + fVar45 * auVar92._8_4_);
  auVar16._12_4_ = auVar14._12_4_ * (fVar46 + fVar46 * auVar92._12_4_);
  auVar16._16_4_ = auVar14._16_4_ * (fVar47 + fVar47 * auVar92._16_4_);
  auVar16._20_4_ = auVar14._20_4_ * (fVar55 + fVar55 * auVar92._20_4_);
  auVar16._24_4_ = auVar14._24_4_ * (fVar56 + fVar56 * auVar92._24_4_);
  auVar16._28_4_ = auVar12._28_4_ + auVar92._28_4_;
  auVar12 = vminps_avx(auVar16,auVar72);
  auVar92 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_2e0 = vmaxps_avx(auVar12,auVar92);
  fVar74 = local_2e0._0_4_;
  fVar87 = local_2e0._4_4_;
  fVar88 = local_2e0._8_4_;
  fVar89 = local_2e0._12_4_;
  fVar77 = local_2e0._16_4_;
  fVar80 = local_2e0._20_4_;
  fVar81 = local_2e0._24_4_;
  fVar38 = auVar54._0_4_ + fVar74 * fVar25;
  fVar45 = auVar54._4_4_ + fVar87 * fVar33;
  fVar46 = auVar54._8_4_ + fVar88 * fVar35;
  fVar47 = auVar54._12_4_ + fVar89 * fVar37;
  fVar48 = auVar54._16_4_ + fVar77 * fVar48;
  fVar49 = auVar54._20_4_ + fVar80 * fVar49;
  fVar50 = auVar54._24_4_ + fVar81 * fVar50;
  fVar51 = auVar90._0_4_ + fVar74 * fVar51;
  fVar55 = auVar90._4_4_ + fVar87 * fVar32;
  fVar56 = auVar90._8_4_ + fVar88 * fVar34;
  fVar57 = auVar90._12_4_ + fVar89 * fVar36;
  fVar58 = auVar90._16_4_ + fVar77 * fVar58;
  fVar59 = auVar90._20_4_ + fVar80 * fVar59;
  fVar60 = auVar90._24_4_ + fVar81 * fVar60;
  auVar12 = vsubps_avx(auVar27,auVar91);
  local_2a0._0_4_ = auVar91._0_4_ + fVar74 * auVar12._0_4_;
  local_2a0._4_4_ = auVar91._4_4_ + fVar87 * auVar12._4_4_;
  local_2a0._8_4_ = auVar91._8_4_ + fVar88 * auVar12._8_4_;
  local_2a0._12_4_ = auVar91._12_4_ + fVar89 * auVar12._12_4_;
  local_2a0._16_4_ = auVar91._16_4_ + fVar77 * auVar12._16_4_;
  local_2a0._20_4_ = auVar91._20_4_ + fVar80 * auVar12._20_4_;
  local_2a0._24_4_ = auVar91._24_4_ + fVar81 * auVar12._24_4_;
  local_2a0._28_4_ = auVar91._28_4_ + auVar12._28_4_;
  auVar73 = ZEXT3264(local_2a0);
  auVar12 = vsubps_avx(local_1c0,local_1a0);
  fVar25 = local_1a0._0_4_ + fVar74 * auVar12._0_4_;
  fVar32 = local_1a0._4_4_ + fVar87 * auVar12._4_4_;
  fVar33 = local_1a0._8_4_ + fVar88 * auVar12._8_4_;
  fVar74 = local_1a0._12_4_ + fVar89 * auVar12._12_4_;
  fVar34 = local_1a0._16_4_ + fVar77 * auVar12._16_4_;
  fVar35 = local_1a0._20_4_ + fVar80 * auVar12._20_4_;
  fVar36 = local_1a0._24_4_ + fVar81 * auVar12._24_4_;
  fVar37 = local_1a0._28_4_ + auVar12._28_4_;
  auVar43._0_4_ = fVar38 * fVar38 + fVar51 * fVar51;
  auVar43._4_4_ = fVar45 * fVar45 + fVar55 * fVar55;
  auVar43._8_4_ = fVar46 * fVar46 + fVar56 * fVar56;
  auVar43._12_4_ = fVar47 * fVar47 + fVar57 * fVar57;
  auVar43._16_4_ = fVar48 * fVar48 + fVar58 * fVar58;
  auVar43._20_4_ = fVar49 * fVar49 + fVar59 * fVar59;
  auVar43._24_4_ = fVar50 * fVar50 + fVar60 * fVar60;
  auVar43._28_4_ = auVar54._28_4_ + auVar13._28_4_ + auVar90._28_4_ + auVar54._28_4_;
  auVar12._4_4_ = fVar32 * fVar32;
  auVar12._0_4_ = fVar25 * fVar25;
  auVar12._8_4_ = fVar33 * fVar33;
  auVar12._12_4_ = fVar74 * fVar74;
  auVar12._16_4_ = fVar34 * fVar34;
  auVar12._20_4_ = fVar35 * fVar35;
  auVar12._24_4_ = fVar36 * fVar36;
  auVar12._28_4_ = auVar90._28_4_ + auVar54._28_4_;
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar62._4_4_ = uVar52;
  auVar62._0_4_ = uVar52;
  auVar62._8_4_ = uVar52;
  auVar62._12_4_ = uVar52;
  auVar62._16_4_ = uVar52;
  auVar62._20_4_ = uVar52;
  auVar62._24_4_ = uVar52;
  auVar62._28_4_ = uVar52;
  auVar13 = vcmpps_avx(auVar43,auVar12,2);
  auVar12 = vcmpps_avx(auVar62,local_2a0,2);
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar63._4_4_ = uVar52;
  auVar63._0_4_ = uVar52;
  auVar63._8_4_ = uVar52;
  auVar63._12_4_ = uVar52;
  auVar63._16_4_ = uVar52;
  auVar63._20_4_ = uVar52;
  auVar63._24_4_ = uVar52;
  auVar63._28_4_ = uVar52;
  auVar14 = vcmpps_avx(local_2a0,auVar63,2);
  auVar12 = vandps_avx(auVar14,auVar12);
  fVar51 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
  auVar12 = vandps_avx(auVar12,auVar13);
  auVar13._4_4_ = fVar51 * (fVar32 + fVar32);
  auVar13._0_4_ = fVar51 * (fVar25 + fVar25);
  auVar13._8_4_ = fVar51 * (fVar33 + fVar33);
  auVar13._12_4_ = fVar51 * (fVar74 + fVar74);
  auVar13._16_4_ = fVar51 * (fVar34 + fVar34);
  auVar13._20_4_ = fVar51 * (fVar35 + fVar35);
  auVar13._24_4_ = fVar51 * (fVar36 + fVar36);
  auVar13._28_4_ = fVar37 + fVar37;
  auVar13 = vcmpps_avx(local_2a0,auVar13,6);
  auVar12 = vandps_avx(auVar13,auVar12);
  auVar39 = vpslld_avx(auVar12._0_16_,0x1f);
  auVar40 = vpsrad_avx(auVar39,0x1f);
  auVar39 = vpslld_avx(auVar12._16_16_,0x1f);
  auVar39 = vpsrad_avx(auVar39,0x1f);
  auVar28._16_16_ = auVar39;
  auVar28._0_16_ = auVar40;
  auVar12 = auVar28 & ~local_340;
  if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0x7f,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar12 >> 0xbf,0) != '\0') ||
      (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0') {
    auVar12 = vandnps_avx(local_340,auVar28);
    local_280 = vsubps_avx(local_1e0,auVar41);
    local_260 = vsubps_avx(local_200,auVar26);
    local_240 = vsubps_avx(local_3c0,local_220);
    auVar13 = vcmpps_avx(auVar92,local_280,4);
    auVar92 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar14 = vcmpps_avx(auVar92,local_260,4);
    auVar14 = vorps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar92,local_240,4);
    auVar13 = vorps_avx(auVar14,auVar13);
    auVar14 = auVar12 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      local_320 = vandps_avx(auVar13,auVar12);
      local_2c0 = ZEXT832(0) << 0x20;
      auVar75._8_4_ = 0x7f800000;
      auVar75._0_8_ = 0x7f8000007f800000;
      auVar75._12_4_ = 0x7f800000;
      auVar75._16_4_ = 0x7f800000;
      auVar75._20_4_ = 0x7f800000;
      auVar75._24_4_ = 0x7f800000;
      auVar75._28_4_ = 0x7f800000;
      auVar76 = ZEXT3264(auVar75);
      auVar12 = vblendvps_avx(auVar75,local_2a0,local_320);
      auVar13 = vshufps_avx(auVar12,auVar12,0xb1);
      auVar13 = vminps_avx(auVar12,auVar13);
      auVar14 = vshufpd_avx(auVar13,auVar13,5);
      auVar13 = vminps_avx(auVar13,auVar14);
      auVar14 = vperm2f128_avx(auVar13,auVar13,1);
      auVar13 = vminps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar12,auVar13,0);
      auVar14 = local_320 & auVar13;
      auVar12 = local_320;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar12 = vandps_avx(auVar13,local_320);
      }
      uVar19 = vmovmskps_avx(auVar12);
      uVar21 = 1 << ((byte)k & 0x1f);
      uVar20 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      uVar24 = (ulong)((uVar21 & 0xf) << 4);
      puVar22 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar21 >> 4) * 0x10);
      auVar12 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar79 = ZEXT3264(auVar12);
      auVar86 = ZEXT864(0) << 0x20;
      do {
        local_370.hit = local_180;
        local_370.valid = (int *)&local_400;
        uVar23 = (ulong)uVar20;
        uVar20 = *(uint *)(local_300 + uVar23 * 4);
        pGVar9 = (pSVar8->geometries).items[uVar20].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_320 + uVar23 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar52 = *(undefined4 *)(local_2e0 + uVar23 * 4);
            uVar1 = *(undefined4 *)(local_2c0 + uVar23 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar23 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_280 + uVar23 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_260 + uVar23 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_240 + uVar23 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar52;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar23];
            *(uint *)(ray + k * 4 + 0x240) = uVar20;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            return;
          }
          local_120 = *(undefined4 *)(local_2e0 + uVar23 * 4);
          local_100 = *(undefined4 *)(local_2c0 + uVar23 * 4);
          local_e0 = (line->primIDs).field_0.i[uVar23];
          uVar52 = *(undefined4 *)(local_280 + uVar23 * 4);
          uVar1 = *(undefined4 *)(local_260 + uVar23 * 4);
          local_160._4_4_ = uVar1;
          local_160._0_4_ = uVar1;
          local_160._8_4_ = uVar1;
          local_160._12_4_ = uVar1;
          local_160._16_4_ = uVar1;
          local_160._20_4_ = uVar1;
          local_160._24_4_ = uVar1;
          local_160._28_4_ = uVar1;
          auStack_b0 = vpshufd_avx(ZEXT416(uVar20),0);
          uVar1 = *(undefined4 *)(local_240 + uVar23 * 4);
          local_140._4_4_ = uVar1;
          local_140._0_4_ = uVar1;
          local_140._8_4_ = uVar1;
          local_140._12_4_ = uVar1;
          local_140._16_4_ = uVar1;
          local_140._20_4_ = uVar1;
          local_140._24_4_ = uVar1;
          local_140._28_4_ = uVar1;
          local_180[0] = (RTCHitN)(char)uVar52;
          local_180[1] = (RTCHitN)(char)((uint)uVar52 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar52;
          local_180[5] = (RTCHitN)(char)((uint)uVar52 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar52;
          local_180[9] = (RTCHitN)(char)((uint)uVar52 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar52;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar52 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar52;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar52 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar52;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar52 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar52;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar52 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar52;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar52 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          local_3e0 = auVar79._0_32_;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          uVar52 = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar23 * 4);
          local_400 = *(undefined8 *)(mm_lookupmask_ps + uVar24);
          uStack_3f8 = *(undefined8 *)(mm_lookupmask_ps + uVar24 + 8);
          local_3f0 = *puVar22;
          uStack_3e8 = puVar22[1];
          local_370.geometryUserPtr = pGVar9->userPtr;
          local_370.context = context->user;
          local_370.N = 8;
          local_370.ray = (RTCRayN *)ray;
          if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_3a0 = auVar73._0_32_;
            local_3c0._0_8_ = puVar22;
            local_340._0_4_ = uVar52;
            (*pGVar9->intersectionFilterN)(&local_370);
            auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar79 = ZEXT3264(local_3e0);
            auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar73 = ZEXT3264(local_3a0);
            puVar22 = (undefined8 *)local_3c0._0_8_;
            uVar52 = local_340._0_4_;
          }
          auVar39._8_8_ = uStack_3f8;
          auVar39._0_8_ = local_400;
          auVar39 = vpcmpeqd_avx(auVar86._0_16_,auVar39);
          auVar40._8_8_ = uStack_3e8;
          auVar40._0_8_ = local_3f0;
          auVar40 = vpcmpeqd_avx(auVar86._0_16_,auVar40);
          auVar29._16_16_ = auVar40;
          auVar29._0_16_ = auVar39;
          local_3e0 = auVar79._0_32_;
          auVar12 = local_3e0 & ~auVar29;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar12 >> 0x7f,0) == '\0') &&
                (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar12 >> 0xbf,0) == '\0') &&
              (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar12[0x1f]) {
            auVar30._0_4_ = auVar79._0_4_ ^ auVar39._0_4_;
            auVar30._4_4_ = auVar79._4_4_ ^ auVar39._4_4_;
            auVar30._8_4_ = auVar79._8_4_ ^ auVar39._8_4_;
            auVar30._12_4_ = auVar79._12_4_ ^ auVar39._12_4_;
            auVar30._16_4_ = auVar79._16_4_ ^ auVar40._0_4_;
            auVar30._20_4_ = auVar79._20_4_ ^ auVar40._4_4_;
            auVar30._24_4_ = auVar79._24_4_ ^ auVar40._8_4_;
            auVar30._28_4_ = auVar79._28_4_ ^ auVar40._12_4_;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              local_3a0 = auVar73._0_32_;
              local_3c0._0_8_ = puVar22;
              local_340._0_4_ = uVar52;
              (*p_Var11)(&local_370);
              auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar79 = ZEXT3264(local_3e0);
              auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar73 = ZEXT3264(local_3a0);
              puVar22 = (undefined8 *)local_3c0._0_8_;
              uVar52 = local_340._0_4_;
            }
            auVar17._8_8_ = uStack_3f8;
            auVar17._0_8_ = local_400;
            auVar39 = vpcmpeqd_avx(auVar86._0_16_,auVar17);
            auVar18._8_8_ = uStack_3e8;
            auVar18._0_8_ = local_3f0;
            auVar40 = vpcmpeqd_avx(auVar86._0_16_,auVar18);
            auVar44._16_16_ = auVar40;
            auVar44._0_16_ = auVar39;
            auVar30._0_4_ = auVar79._0_4_ ^ auVar39._0_4_;
            auVar30._4_4_ = auVar79._4_4_ ^ auVar39._4_4_;
            auVar30._8_4_ = auVar79._8_4_ ^ auVar39._8_4_;
            auVar30._12_4_ = auVar79._12_4_ ^ auVar39._12_4_;
            auVar30._16_4_ = auVar79._16_4_ ^ auVar40._0_4_;
            auVar30._20_4_ = auVar79._20_4_ ^ auVar40._4_4_;
            auVar30._24_4_ = auVar79._24_4_ ^ auVar40._8_4_;
            auVar30._28_4_ = auVar79._28_4_ ^ auVar40._12_4_;
            auVar12 = auVar79._0_32_ & ~auVar44;
            if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0x7f,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0xbf,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar12[0x1f] < '\0') {
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])local_370.hit);
              *(undefined1 (*) [32])(local_370.ray + 0x180) = auVar12;
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(local_370.hit + 0x20));
              *(undefined1 (*) [32])(local_370.ray + 0x1a0) = auVar12;
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(local_370.hit + 0x40));
              *(undefined1 (*) [32])(local_370.ray + 0x1c0) = auVar12;
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(local_370.hit + 0x60));
              *(undefined1 (*) [32])(local_370.ray + 0x1e0) = auVar12;
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(local_370.hit + 0x80));
              *(undefined1 (*) [32])(local_370.ray + 0x200) = auVar12;
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(local_370.hit + 0xa0));
              *(undefined1 (*) [32])(local_370.ray + 0x220) = auVar12;
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(local_370.hit + 0xc0));
              *(undefined1 (*) [32])(local_370.ray + 0x240) = auVar12;
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(local_370.hit + 0xe0));
              *(undefined1 (*) [32])(local_370.ray + 0x260) = auVar12;
              auVar12 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(local_370.hit + 0x100));
              *(undefined1 (*) [32])(local_370.ray + 0x280) = auVar12;
            }
          }
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0x7f,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar30 >> 0xbf,0) == '\0') &&
              (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar30[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar52;
          }
          *(undefined4 *)(local_320 + uVar23 * 4) = 0;
          uVar52 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar31._4_4_ = uVar52;
          auVar31._0_4_ = uVar52;
          auVar31._8_4_ = uVar52;
          auVar31._12_4_ = uVar52;
          auVar31._16_4_ = uVar52;
          auVar31._20_4_ = uVar52;
          auVar31._24_4_ = uVar52;
          auVar31._28_4_ = uVar52;
          auVar12 = vcmpps_avx(auVar73._0_32_,auVar31,2);
          local_320 = vandps_avx(auVar12,local_320);
        }
        if ((((((((local_320 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_320 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_320 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_320 >> 0x7f,0) == '\0') &&
              (local_320 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_320 >> 0xbf,0) == '\0') &&
            (local_320 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_320[0x1f]) {
          return;
        }
        auVar12 = vblendvps_avx(auVar76._0_32_,auVar73._0_32_,local_320);
        auVar13 = vshufps_avx(auVar12,auVar12,0xb1);
        auVar13 = vminps_avx(auVar12,auVar13);
        auVar14 = vshufpd_avx(auVar13,auVar13,5);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar14 = vperm2f128_avx(auVar13,auVar13,1);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar13 = vcmpps_avx(auVar12,auVar13,0);
        auVar14 = local_320 & auVar13;
        auVar12 = local_320;
        if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0x7f,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0xbf,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar14[0x1f] < '\0') {
          auVar12 = vandps_avx(auVar13,local_320);
        }
        uVar19 = vmovmskps_avx(auVar12);
        uVar20 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }